

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib555.c
# Opt level: O1

size_t readcallback(void *ptr,size_t size,size_t nmemb,void *clientp)

{
  char *pcVar1;
  
  if (*clientp == 0) {
    *(undefined4 *)clientp = 1;
    if (0x24 < nmemb * size) {
      curl_mfprintf(_stderr,"READ!\n");
      *(undefined8 *)((long)ptr + 0x1d) = 0xa64616f6c7075;
      *(undefined8 *)ptr = 0x2073692073696874;
      builtin_strncpy((char *)((long)ptr + 8),"the blur",8);
      builtin_strncpy((char *)((long)ptr + 0x10),"b we wan",8);
      builtin_strncpy((char *)((long)ptr + 0x18),"t to upl",8);
      return 0x24;
    }
    pcVar1 = "READ NOT FINE!\n";
  }
  else {
    pcVar1 = "READ ALREADY DONE!\n";
  }
  curl_mfprintf(_stderr,pcVar1);
  return 0;
}

Assistant:

static size_t readcallback(void  *ptr,
                           size_t size,
                           size_t nmemb,
                           void *clientp)
{
  int *counter = (int *)clientp;

  if(*counter) {
    /* only do this once and then require a clearing of this */
    fprintf(stderr, "READ ALREADY DONE!\n");
    return 0;
  }
  (*counter)++; /* bump */

  if(size * nmemb > strlen(uploadthis)) {
    fprintf(stderr, "READ!\n");
    strcpy(ptr, uploadthis);
    return strlen(uploadthis);
  }
  fprintf(stderr, "READ NOT FINE!\n");
  return 0;
}